

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_Vx_annotation.cpp
# Opt level: O2

ON_OBSOLETE_V5_DimRadial *
ON_OBSOLETE_V5_DimRadial::CreateFromV6DimRadial
          (ON_DimRadial *V6_dim_radial,ON_3dmAnnotationContext *annotation_context,
          ON_OBSOLETE_V5_DimRadial *destination)

{
  AnnotationType AVar1;
  V5_TextDisplayMode mode;
  bool bVar2;
  int iVar3;
  ON_DimStyle *parent_dimstyle;
  ON_DimStyle *V6_dim_style;
  ON_Plane *plane;
  ON_2dPoint *pOVar4;
  wchar_t *pwVar5;
  ON_OBSOLETE_V5_DimExtra *this;
  ulong uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  ON_UUID detail_id;
  ON_2dPoint OVar11;
  ON_wString plaintext;
  ON_2dPointArray dimpoints;
  
  if (annotation_context == (ON_3dmAnnotationContext *)0x0) {
    annotation_context = &ON_3dmAnnotationContext::Default;
  }
  parent_dimstyle = ON_3dmAnnotationContext::ParentDimStyle(annotation_context);
  if (destination == (ON_OBSOLETE_V5_DimRadial *)0x0) {
    destination = (ON_OBSOLETE_V5_DimRadial *)operator_new(0xe0);
    ON_OBSOLETE_V5_DimRadial(destination);
  }
  AVar1 = ON_Annotation::Type((ON_Annotation *)V6_dim_radial);
  ON_OBSOLETE_V5_Annotation::SetType
            (&destination->super_ON_OBSOLETE_V5_Annotation,AVar1 == Radius | dtDimDiameter);
  V6_dim_style = ON_Annotation::DimensionStyle((ON_Annotation *)V6_dim_radial,parent_dimstyle);
  mode = ON_INTERNAL_OBSOLETE::V5TextDisplayModeFromV6DimStyle(V6_dim_style);
  ON_OBSOLETE_V5_Annotation::SetTextDisplayMode(&destination->super_ON_OBSOLETE_V5_Annotation,mode);
  plane = ON_Annotation::Plane((ON_Annotation *)V6_dim_radial);
  ON_OBSOLETE_V5_Annotation::SetPlane(&destination->super_ON_OBSOLETE_V5_Annotation,plane);
  ON_2dPointArray::ON_2dPointArray(&dimpoints,4);
  OVar11 = ON_DimRadial::CenterPoint(V6_dim_radial);
  pOVar4 = ON_SimpleArray<ON_2dPoint>::AppendNew(&dimpoints.super_ON_SimpleArray<ON_2dPoint>);
  *pOVar4 = OVar11;
  OVar11 = ON_DimRadial::RadiusPoint(V6_dim_radial);
  pOVar4 = ON_SimpleArray<ON_2dPoint>::AppendNew(&dimpoints.super_ON_SimpleArray<ON_2dPoint>);
  *pOVar4 = OVar11;
  OVar11 = ON_DimRadial::DimlinePoint(V6_dim_radial);
  pOVar4 = ON_SimpleArray<ON_2dPoint>::AppendNew(&dimpoints.super_ON_SimpleArray<ON_2dPoint>);
  *pOVar4 = OVar11;
  OVar11 = ON_DimRadial::KneePoint(V6_dim_radial);
  pOVar4 = ON_SimpleArray<ON_2dPoint>::AppendNew(&dimpoints.super_ON_SimpleArray<ON_2dPoint>);
  *pOVar4 = OVar11;
  bVar2 = ON_Annotation::LeaderHasLanding((ON_Annotation *)V6_dim_radial,parent_dimstyle);
  dVar7 = ON_Annotation::DimScale((ON_Annotation *)V6_dim_radial,parent_dimstyle);
  dVar8 = ON_Annotation::TextHeight((ON_Annotation *)V6_dim_radial,parent_dimstyle);
  if (bVar2) {
    dVar9 = ON_Annotation::LeaderLandingLength((ON_Annotation *)V6_dim_radial,parent_dimstyle);
    dVar9 = dVar7 * dVar9;
    dVar10 = dimpoints.super_ON_SimpleArray<ON_2dPoint>.m_a[3].x;
  }
  else {
    dVar10 = dimpoints.super_ON_SimpleArray<ON_2dPoint>.m_a[3].x;
    dVar9 = 0.0;
    if (ABS(dVar10 - dimpoints.super_ON_SimpleArray<ON_2dPoint>.m_a[2].x) < 2.3283064365386963e-10)
    {
      dVar9 = dVar7 * dVar8;
    }
  }
  uVar6 = -(ulong)(dVar10 < dimpoints.super_ON_SimpleArray<ON_2dPoint>.m_a[1].x);
  dimpoints.super_ON_SimpleArray<ON_2dPoint>.m_a[2].x =
       (double)(~uVar6 & (ulong)dVar9 | (ulong)-dVar9 & uVar6) +
       dimpoints.super_ON_SimpleArray<ON_2dPoint>.m_a[2].x;
  ON_OBSOLETE_V5_Annotation::SetPoints(&destination->super_ON_OBSOLETE_V5_Annotation,&dimpoints);
  iVar3 = (*(V6_dim_radial->super_ON_Dimension).super_ON_Annotation.super_ON_Geometry.
            super_ON_Object._vptr_ON_Object[0x2b])(V6_dim_radial);
  ON_OBSOLETE_V5_Annotation::SetUserPositionedText
            (&destination->super_ON_OBSOLETE_V5_Annotation,(uint)(byte)((byte)iVar3 ^ 1));
  pwVar5 = ON_Dimension::PlainUserText(&V6_dim_radial->super_ON_Dimension);
  ON_wString::ON_wString(&plaintext,pwVar5);
  pwVar5 = ON_wString::operator_cast_to_wchar_t_(&plaintext);
  ON_OBSOLETE_V5_Annotation::SetTextValue(&destination->super_ON_OBSOLETE_V5_Annotation,pwVar5);
  (destination->super_ON_OBSOLETE_V5_Annotation).m_textheight = dVar8;
  iVar3 = ON_3dmAnnotationContext::V5_ArchiveDimStyleIndex(annotation_context);
  ON_OBSOLETE_V5_Annotation::SetV5_3dmArchiveDimStyleIndex
            (&destination->super_ON_OBSOLETE_V5_Annotation,iVar3);
  this = ON_OBSOLETE_V5_DimExtra::DimensionExtension(destination,true);
  if (this != (ON_OBSOLETE_V5_DimExtra *)0x0) {
    detail_id = ON_Dimension::DetailMeasured(&V6_dim_radial->super_ON_Dimension);
    ON_OBSOLETE_V5_DimExtra::SetDetailMeasured(this,detail_id);
    dVar7 = ON_Dimension::DistanceScale(&V6_dim_radial->super_ON_Dimension);
    ON_OBSOLETE_V5_DimExtra::SetDistanceScale(this,dVar7);
  }
  ON_wString::~ON_wString(&plaintext);
  ON_SimpleArray<ON_2dPoint>::~ON_SimpleArray(&dimpoints.super_ON_SimpleArray<ON_2dPoint>);
  return (ON_OBSOLETE_V5_DimRadial *)&destination->super_ON_OBSOLETE_V5_Annotation;
}

Assistant:

ON_OBSOLETE_V5_DimRadial* ON_OBSOLETE_V5_DimRadial::CreateFromV6DimRadial(
  const class ON_DimRadial& V6_dim_radial,
  const class ON_3dmAnnotationContext* annotation_context,
  ON_OBSOLETE_V5_DimRadial* destination
)
{
  if (nullptr == annotation_context)
    annotation_context = &ON_3dmAnnotationContext::Default;
  const ON_DimStyle& parent_dim_style = annotation_context->ParentDimStyle();

  ON_OBSOLETE_V5_DimRadial* V5_dim_radial
    = (nullptr != destination)
    ? destination
    : new ON_OBSOLETE_V5_DimRadial();

  if (ON::AnnotationType::Radius == V6_dim_radial.Type())
    V5_dim_radial->SetType(ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimRadius);
  else
    V5_dim_radial->SetType(ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimDiameter);

  //ON::TextVerticalAlignment valign = dimstyle->TextVerticalAlignment();
  ON_INTERNAL_OBSOLETE::V5_TextDisplayMode mode = ON_INTERNAL_OBSOLETE::V5TextDisplayModeFromV6DimStyle(V6_dim_radial.DimensionStyle(parent_dim_style));

  V5_dim_radial->SetTextDisplayMode(mode);
  V5_dim_radial->SetPlane(V6_dim_radial.Plane());
  ON_2dPointArray dimpoints(4);
  dimpoints.AppendNew() = V6_dim_radial.CenterPoint();
  dimpoints.AppendNew() = V6_dim_radial.RadiusPoint();
  dimpoints.AppendNew() = V6_dim_radial.DimlinePoint();
  dimpoints.AppendNew() = V6_dim_radial.KneePoint();
  
  double ll = 0.0;
  const bool bLeaderHasLanding = V6_dim_radial.LeaderHasLanding(&parent_dim_style);
  const double dim_scale = V6_dim_radial.DimScale(&parent_dim_style);
  const double text_height = V6_dim_radial.TextHeight(&parent_dim_style);

  if( bLeaderHasLanding )
    ll = V6_dim_radial.LeaderLandingLength(&parent_dim_style) * dim_scale;
  else if (fabs(dimpoints[3].x - dimpoints[2].x) < ON_ZERO_TOLERANCE)
    ll = text_height * dim_scale;

  if (dimpoints[3].x >= dimpoints[1].x)
    dimpoints[2].x += ll;
  else
    dimpoints[2].x -= ll;

  V5_dim_radial->SetPoints(dimpoints);
  V5_dim_radial->SetUserPositionedText(!V6_dim_radial.UseDefaultTextPoint());
  
  const ON_wString plaintext = V6_dim_radial.PlainUserText();
  V5_dim_radial->SetTextValue(plaintext);
  
  V5_dim_radial->m_textheight = text_height;

  V5_dim_radial->SetV5_3dmArchiveDimStyleIndex(annotation_context->V5_ArchiveDimStyleIndex() );

  ON_OBSOLETE_V5_DimExtra* extra = ON_OBSOLETE_V5_DimExtra::DimensionExtension(V5_dim_radial, true);
  if (nullptr != extra)
  {
    extra->SetDetailMeasured(V6_dim_radial.DetailMeasured());
    extra->SetDistanceScale(V6_dim_radial.DistanceScale());
  }

  return V5_dim_radial;
}